

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O2

void __thiscall
dg::WalkAndMark<dg::LLVMNode>::WalkAndMark(WalkAndMark<dg::LLVMNode> *this,bool forward_slc)

{
  _Rb_tree_header *p_Var1;
  uint32_t opts;
  undefined7 in_register_00000031;
  
  opts = 0x1d8;
  if ((int)CONCAT71(in_register_00000031,forward_slc) != 0) {
    opts = 0xa4;
  }
  legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::NodesWalk
            (&this->super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>,opts);
  (this->super_NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>)._vptr_NodesWalk =
       (_func_int **)&PTR_prepare_00146bb0;
  this->forward_slice = forward_slc;
  p_Var1 = &(this->markedBlocks)._M_t._M_impl.super__Rb_tree_header;
  (this->markedBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->markedBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->markedBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->markedBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->markedBlocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

WalkAndMark(bool forward_slc = false)
            : legacy::NodesWalk<NodeT, Queue>(
                      forward_slc
                              ? (legacy::NODES_WALK_DD | // legacy::NODES_WALK_CD
                                                         // NOTE: we handle CD
                                                         // separately
                                 legacy::NODES_WALK_USE | legacy::NODES_WALK_ID)
                              : (legacy::NODES_WALK_REV_CD |
                                 legacy::NODES_WALK_REV_DD |
                                 legacy::NODES_WALK_USER |
                                 legacy::NODES_WALK_ID |
                                 legacy::NODES_WALK_REV_ID)),
              forward_slice(forward_slc) {}